

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator+=(path *this,string_type *x)

{
  path *ppVar1;
  string_type *x_local;
  path *this_local;
  
  ppVar1 = concat<std::__cxx11::string>(this,x);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator+=(const string_type& x)
{
    return concat(x);
}